

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
AppParametersTest_single_value_eq_Test::~AppParametersTest_single_value_eq_Test
          (AppParametersTest_single_value_eq_Test *this)

{
  AppParametersTest_single_value_eq_Test *this_local;
  
  ~AppParametersTest_single_value_eq_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AppParametersTest, single_value_eq) {
	ArgWrapper args{ "/path/to/exe", "-key=value" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 1U);
	EXPECT_EQ(parameters.switches().size(), 0U);
	EXPECT_EQ(parameters.switches_set().size(), 0U);
	EXPECT_EQ(parameters.values().size(), 1U);

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"-key=value" };
	std::map<std::u8string, object> expected_values{ { u8"key", u8"value" } };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Values"], expected_values);
}